

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O3

TConstUnion __thiscall glslang::TConstUnion::operator|(TConstUnion *this,TConstUnion *constant)

{
  TBasicType TVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  TConstUnion TVar7;
  
  TVar1 = this->type;
  if (TVar1 != constant->type) {
    __assert_fail("type == constant.type",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x2ff,"TConstUnion glslang::TConstUnion::operator|(const TConstUnion &) const");
  }
  switch(TVar1) {
  case EbtInt8:
  case EbtUint8:
    uVar4 = (ulong)((constant->field_0).u8Const | (this->field_0).u8Const);
    uVar5 = 0;
    break;
  case EbtInt16:
  case EbtUint16:
    uVar2 = (constant->field_0).u16Const | (this->field_0).u16Const;
    uVar4 = (ulong)uVar2;
    uVar5 = (uint)(uVar2 >> 8);
    break;
  case EbtInt:
  case EbtUint:
    uVar3 = (constant->field_0).uConst | (this->field_0).uConst;
    uVar4 = (ulong)uVar3;
    uVar5 = uVar3 >> 8;
    uVar3 = uVar3 >> 0x10;
    goto LAB_00471380;
  case EbtInt64:
  case EbtUint64:
    uVar4 = (constant->field_0).u64Const | (this->field_0).u64Const;
    uVar5 = (uint)uVar4 >> 8;
    uVar3 = (uint)(uVar4 >> 0x10);
    uVar6 = uVar4 & 0xffffffff00000000;
    goto LAB_00471382;
  default:
    __assert_fail("false && \"Default missing\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x309,"TConstUnion glslang::TConstUnion::operator|(const TConstUnion &) const");
  }
  uVar3 = 0;
LAB_00471380:
  uVar6 = 0;
LAB_00471382:
  TVar7.field_0 = ((uint)uVar4 & 0xff | (uVar5 & 0xff) << 8 | uVar3 << 0x10) | uVar6;
  TVar7.type = TVar1;
  TVar7._12_4_ = 0;
  return TVar7;
}

Assistant:

TConstUnion operator|(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        assert(type == constant.type);
        switch (type) {
        case EbtInt:    returnValue.setIConst(iConst | constant.iConst); break;
        case EbtUint:   returnValue.setUConst(uConst | constant.uConst); break;
        case EbtInt8:   returnValue.setI8Const(i8Const | constant.i8Const); break;
        case EbtUint8:  returnValue.setU8Const(u8Const | constant.u8Const); break;
        case EbtInt16:  returnValue.setI16Const(i16Const | constant.i16Const); break;
        case EbtUint16: returnValue.setU16Const(u16Const | constant.u16Const); break;
        case EbtInt64:  returnValue.setI64Const(i64Const | constant.i64Const); break;
        case EbtUint64: returnValue.setU64Const(u64Const | constant.u64Const); break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }